

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall Liby::TimerQueue::destroy(TimerQueue *this)

{
  this->timerfd_ = -1;
  std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)
             &this->timerChan_,(pointer)0x0);
  std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::_M_erase_at_end
            (&(this->queue_).heap,
             (this->queue_).heap.
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (this->queue_).size_ = 0;
  return;
}

Assistant:

void TimerQueue::destroy() {
#ifdef __linux__
    timerfd_ = -1;
    timerChan_.reset();
#endif
    queue_.clear();
}